

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

void nni_dialer_shutdown(nni_dialer *d)

{
  nni_sock *pnVar1;
  _Bool _Var2;
  nni_pipe *p;
  nni_mtx *mtx;
  
  pnVar1 = d->d_sock;
  _Var2 = nni_atomic_flag_test_and_set(&d->d_closing);
  if (_Var2) {
    return;
  }
  nni_dialer_stop(d);
  mtx = &pnVar1->s_mx;
  nni_mtx_lock(mtx);
  for (p = (nni_pipe *)nni_list_first(&d->d_pipes); p != (nni_pipe *)0x0;
      p = (nni_pipe *)nni_list_next(&d->d_pipes,p)) {
    nni_pipe_close(p);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_dialer_shutdown(nni_dialer *d)
{
	nni_sock *s = d->d_sock;
	nni_pipe *p;

	if (nni_atomic_flag_test_and_set(&d->d_closing)) {
		return;
	}

	nni_dialer_stop(d);

	nni_mtx_lock(&s->s_mx);
	NNI_LIST_FOREACH (&d->d_pipes, p) {
		nni_pipe_close(p);
	}
	nni_mtx_unlock(&s->s_mx);
}